

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O1

AddressingModel __thiscall
spvtools::val::Instruction::GetOperandAs<spv::AddressingModel>(Instruction *this,size_t index)

{
  pointer psVar1;
  
  psVar1 = (this->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= index) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  if (psVar1[index].num_words != 0) {
    if ((uint)psVar1[index].num_words + (uint)psVar1[index].offset <= (uint)(this->inst_).num_words)
    {
      return (this->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[psVar1[index].offset];
    }
    __assert_fail("o.offset + o.num_words <= inst_.num_words",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/instruction.h"
                  ,0x6a,
                  "T spvtools::val::Instruction::GetOperandAs(size_t) const [T = spv::AddressingModel]"
                 );
  }
  __assert_fail("o.num_words * 4 >= sizeof(T)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/instruction.h"
                ,0x69,
                "T spvtools::val::Instruction::GetOperandAs(size_t) const [T = spv::AddressingModel]"
               );
}

Assistant:

T GetOperandAs(size_t index) const {
    const spv_parsed_operand_t& o = operands_.at(index);
    assert(o.num_words * 4 >= sizeof(T));
    assert(o.offset + o.num_words <= inst_.num_words);
    return *reinterpret_cast<const T*>(&words_[o.offset]);
  }